

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutAlsa::sendMessage(MidiOutAlsa *this,uchar *message,size_t size)

{
  undefined8 *puVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  string *psVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  snd_seq_event_t ev;
  string local_f8;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined1 uStack_cc;
  undefined1 uStack_cb;
  undefined2 uStack_ca;
  undefined4 uStack_c8;
  undefined8 uStack_c4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  puVar1 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  uVar9 = (uint)size;
  if (*(uint *)(puVar1 + 4) < uVar9) {
    *(uint *)(puVar1 + 4) = uVar9;
    iVar4 = snd_midi_event_resize_buffer(puVar1[3]);
    if (iVar4 == 0) {
      free((void *)puVar1[5]);
      pvVar5 = malloc((ulong)*(uint *)(puVar1 + 4));
      puVar1[5] = pvVar5;
      if (pvVar5 != (void *)0x0) goto LAB_0018f4dc;
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x1beb64);
      paVar12 = &local_70.field_2;
      pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,
                 pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_70);
      _Var11._M_p = local_70._M_dataplus._M_p;
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x1bed65);
      paVar12 = &local_50.field_2;
      pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,
                 pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_50);
      _Var11._M_p = local_50._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var11._M_p != paVar12) {
      operator_delete(_Var11._M_p);
    }
  }
  else {
LAB_0018f4dc:
    if (uVar9 != 0) {
      uVar8 = 0;
      do {
        *(uchar *)(puVar1[5] + uVar8) = message[uVar8];
        uVar8 = uVar8 + 1;
      } while ((size & 0xffffffff) != uVar8);
    }
    psVar6 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
    uVar10 = 0;
    do {
      if (uVar9 < uVar10 || uVar9 - uVar10 == 0) {
        snd_seq_drain_output(*puVar1);
        return;
      }
      uStack_c8 = 0;
      uStack_c4 = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      uStack_cb = *(undefined1 *)((long)puVar1 + 0xc);
      uStack_ca = 0xfdfe;
      local_d8 = 0xfd000000;
      lVar7 = snd_midi_event_encode(puVar1[3],(ulong)uVar10 + puVar1[5],uVar9 - uVar10,&local_d8);
      if (lVar7 < 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)psVar6,0,
                   (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                   0x1beda6);
        pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,
                   pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
        MidiApi::error((MidiApi *)this,WARNING,&local_90);
        _Var11._M_p = local_90._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_0018f6c1;
LAB_0018f6d5:
        bVar3 = false;
      }
      else {
        if ((char)local_d8 == -1) {
          std::__cxx11::string::_M_replace
                    ((ulong)psVar6,0,
                     (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                     0x1bedd5);
          pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,pcVar2,
                     pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
          MidiApi::error((MidiApi *)this,WARNING,&local_f8);
          _Var11._M_p = local_f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_0018f6c1;
        }
        else {
          uVar10 = uVar10 + (int)lVar7;
          iVar4 = snd_seq_event_output(*puVar1);
          bVar3 = true;
          if (-1 < iVar4) goto LAB_0018f6da;
          std::__cxx11::string::_M_replace
                    ((ulong)psVar6,0,
                     (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                     0x1bee03);
          pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar2,
                     pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
          MidiApi::error((MidiApi *)this,WARNING,&local_b0);
          _Var11._M_p = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_0018f6d5;
LAB_0018f6c1:
          operator_delete(_Var11._M_p);
        }
        bVar3 = false;
      }
LAB_0018f6da:
    } while (bVar3);
  }
  return;
}

Assistant:

void MidiOutAlsa :: sendMessage( const unsigned char *message, size_t size )
{
  long result;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  unsigned int nBytes = static_cast<unsigned int> (size);
  if ( nBytes > data->bufferSize ) {
    data->bufferSize = nBytes;
    result = snd_midi_event_resize_buffer( data->coder, nBytes );
    if ( result != 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    free (data->buffer);
    data->buffer = (unsigned char *) malloc( data->bufferSize );
    if ( data->buffer == NULL ) {
      errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
      error( RtMidiError::MEMORY_ERROR, errorString_ );
      return;
    }
  }

  for ( unsigned int i=0; i<nBytes; ++i ) data->buffer[i] = message[i];

  unsigned int offset = 0;
  while (offset < nBytes) {
    snd_seq_event_t ev;
    snd_seq_ev_clear( &ev );
    snd_seq_ev_set_source( &ev, data->vport );
    snd_seq_ev_set_subs( &ev );
    snd_seq_ev_set_direct( &ev );
    result = snd_midi_event_encode( data->coder, data->buffer + offset,
                                    (long)(nBytes - offset), &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: event parsing error!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    if ( ev.type == SND_SEQ_EVENT_NONE ) {
      errorString_ = "MidiOutAlsa::sendMessage: incomplete message!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    offset += result;

    // Send the event.
    result = snd_seq_event_output( data->seq, &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: error sending MIDI message to port.";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }
  }
  snd_seq_drain_output( data->seq );
}